

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryStream.cpp
# Opt level: O0

ssize_t __thiscall
tfs::OutBinaryStream::write(OutBinaryStream *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  undefined4 in_register_00000034;
  undefined1 local_1;
  
  uVar1 = std::ios::bad();
  if (((uVar1 & 1) == 0) && (CONCAT44(in_register_00000034,__fd) != 0)) {
    if (__buf == (void *)0x0) {
      local_1 = 1;
    }
    else {
      std::ostream::write((char *)&this->m_stream,CONCAT44(in_register_00000034,__fd));
      uVar1 = std::ios::good();
      uVar1 = uVar1 & 0xffffffffffffff01;
      local_1 = (undefined1)uVar1;
    }
  }
  else {
    local_1 = 0;
  }
  return CONCAT71((int7)(uVar1 >> 8),local_1);
}

Assistant:

bool
    OutBinaryStream::write( const char *buffer, unsigned long count ) {
        if( m_stream.bad() || buffer == 0 ) {
            return false;
        }
        if( count < 1 ) {
            return true;
        }
        m_stream.write( buffer, (std::streamsize)count );
        return m_stream.good();
    }